

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O2

string * XMLIDEncode(string *__return_storage_ptr__,string *name)

{
  char *pcVar1;
  long lVar2;
  char *pcVar3;
  char cVar4;
  char XML_ID_CHARS [66];
  stringstream idEncoded;
  ostream local_1a8 [376];
  
  pcVar1 = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz_-.";
  pcVar3 = XML_ID_CHARS;
  for (lVar2 = 0x42; lVar2 != 0; lVar2 = lVar2 + -1) {
    *pcVar3 = *pcVar1;
    pcVar1 = pcVar1 + 1;
    pcVar3 = pcVar3 + 1;
  }
  if (name->_M_string_length == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)name);
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)&idEncoded);
    pcVar1 = (name->_M_dataplus)._M_p;
    if (0x39 < (byte)(*pcVar1 + 0xbfU)) {
      std::operator<<(local_1a8,'_');
      pcVar1 = (name->_M_dataplus)._M_p;
    }
    for (pcVar3 = pcVar1; pcVar3 != pcVar1 + name->_M_string_length; pcVar3 = pcVar3 + 1) {
      cVar4 = *pcVar3;
      pcVar1 = strchr(XML_ID_CHARS,(int)cVar4);
      if (pcVar1 == (char *)0x0) {
        cVar4 = XML_ID_CHARS[(ulong)(uint)(int)cVar4 % 0x42];
      }
      std::operator<<(local_1a8,cVar4);
      pcVar1 = (name->_M_dataplus)._M_p;
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)&idEncoded);
  }
  return __return_storage_ptr__;
}

Assistant:

static const std::string XMLIDEncode(const std::string& name) {
    const char XML_ID_CHARS[] = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz_-.";
    const unsigned int XML_ID_CHARS_COUNT = sizeof(XML_ID_CHARS) / sizeof(char);

    if (name.length() == 0) {
        return name;
    }

    std::stringstream idEncoded;

    // xsd:ID must start with letter or underscore
    if (!((name[0] >= 'A' && name[0] <= 'z') || name[0] == '_')) {
        idEncoded << '_';
    }

    for (std::string::const_iterator it = name.begin(); it != name.end(); ++it) {
        // xsd:ID can only contain letters, digits, underscores, hyphens and periods
        if (strchr(XML_ID_CHARS, *it) != nullptr) {
            idEncoded << *it;
        } else {
            // Select placeholder character based on invalid character to prevent name collisions 
            idEncoded << XML_ID_CHARS[(*it) % XML_ID_CHARS_COUNT];
        }
    }

    return idEncoded.str();
}